

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O3

void doprev_message(void)

{
  nh_menuitem_conflict *pnVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  nh_menuitem_conflict *items;
  size_t sVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  wchar_t wVar10;
  wchar_t wVar11;
  ulong uVar12;
  long lVar13;
  wchar_t output_count;
  char **output;
  char buf [120];
  int local_d8;
  wchar_t local_cc;
  ulong local_c8;
  char **local_c0;
  uint local_b8;
  wchar_t local_b4;
  ulong local_b0;
  char local_a8 [120];
  
  wVar11 = histsize;
  if (histsize < L'\x01') {
    items = (nh_menuitem_conflict *)malloc(0xa78);
    uVar12 = 0;
  }
  else {
    uVar7 = 0;
    wVar10 = L'\0';
    do {
      iVar5 = histpos + L'\x01' + wVar10;
      wVar10 = wVar10 + L'\x01';
      if ((int)uVar7 < msghistory[iVar5 % histsize].turn) {
        uVar7 = msghistory[iVar5 % histsize].turn;
      }
    } while (histsize != wVar10);
    uVar12 = 0;
    iVar5 = 0;
    if (uVar7 != 0) {
      iVar5 = 0;
      do {
        iVar5 = iVar5 + 1;
        bVar4 = 9 < uVar7;
        uVar7 = uVar7 / 10;
      } while (bVar4);
    }
    uVar7 = iVar5 + (uint)(iVar5 == 0);
    items = (nh_menuitem_conflict *)malloc(0xa78);
    if (L'\0' < wVar11) {
      local_b4 = L'I' - uVar7;
      local_b0 = (ulong)local_b4;
      local_d8 = 10;
      uVar8 = 0;
      wVar10 = L'\0';
      uVar12 = 0;
      local_b8 = uVar7;
      do {
        wVar10 = wVar10 + L'\x01';
        iVar5 = (histpos + wVar10) % wVar11;
        uVar2 = msghistory[iVar5].turn;
        if (uVar2 != 0) {
          pcVar3 = msghistory[iVar5].msg;
          sVar6 = strlen(pcVar3);
          iVar5 = (int)uVar12;
          local_c8 = (ulong)iVar5;
          if (local_b0 < sVar6) {
            ui_wrap_text(local_b4,pcVar3,&local_cc,&local_c0);
            if (uVar2 == uVar8) {
              snprintf(local_a8,0x78,"\t%s");
            }
            else {
              snprintf(local_a8,0x78,"T:%*d\t%s");
            }
            if (local_d8 <= iVar5) {
              local_d8 = local_d8 * 2;
              items = (nh_menuitem_conflict *)realloc(items,(long)local_d8 * 0x10c);
            }
            pnVar1 = items + local_c8;
            pnVar1->id = L'\0';
            pnVar1->role = MI_TEXT;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,local_a8);
            uVar8 = iVar5 + 1;
            if (L'\x01' < local_cc) {
              lVar13 = (long)(int)uVar8 * 0x10c + 0x10a;
              lVar9 = 1;
              local_c8 = uVar12;
              do {
                snprintf(local_a8,0x78,"\t%s",local_c0[lVar9]);
                if ((long)local_d8 <= (int)uVar8 + lVar9 + -1) {
                  local_d8 = local_d8 * 2;
                  items = (nh_menuitem_conflict *)realloc(items,(long)local_d8 * 0x10c);
                }
                pcVar3 = items->caption + lVar13 + -8;
                *(undefined8 *)(pcVar3 + -0x10a) = 0;
                *(undefined2 *)(pcVar3 + -2) = MI_TEXT >> 0x10;
                *pcVar3 = '\0';
                strcpy(pcVar3 + -0x102,local_a8);
                lVar9 = lVar9 + 1;
                lVar13 = lVar13 + 0x10c;
              } while (lVar9 < local_cc);
              uVar8 = (int)local_c8 + (int)lVar9;
              uVar7 = local_b8;
            }
            ui_free_wrap(local_c0);
          }
          else {
            if (uVar2 == uVar8) {
              snprintf(local_a8,0x78,"\t%s");
            }
            else {
              snprintf(local_a8,0x78,"T:%*d\t%s",(ulong)uVar7,(ulong)uVar2,pcVar3);
            }
            if (local_d8 <= iVar5) {
              local_d8 = local_d8 * 2;
              items = (nh_menuitem_conflict *)realloc(items,(long)local_d8 * 0x10c);
            }
            pnVar1 = items + local_c8;
            pnVar1->id = L'\0';
            pnVar1->role = MI_TEXT;
            pnVar1->accel = '\0';
            pnVar1->group_accel = '\0';
            pnVar1->selected = '\0';
            strcpy(pnVar1->caption,local_a8);
            uVar8 = iVar5 + 1;
          }
          uVar12 = (ulong)uVar8;
          uVar8 = uVar2;
        }
        wVar11 = histsize;
      } while (wVar10 < histsize);
    }
  }
  curses_display_menu_bottom(items,(wchar_t)uVar12,"Message history:",L'\0',(wchar_t *)0x0);
  free(items);
  return;
}

Assistant:

void doprev_message(void)
{
    /* 80 chars - 2 (borders) - 2 (gutters) - "T:" - 1 (divider) */
    const int hist_msg_width = 73;

    int prevturn;
    int pos;
    int maxturn, maxturn_width;

    struct nh_menuitem *items;
    char buf[MSGLEN+1];
    int icount, size, i;

    /* keep the previous messages window within 80 characters */
    maxturn = 0;
    for (i = 0; i < histsize; i++) {
	pos = (histpos + i + 1) % histsize;
	if (msghistory[pos].turn > maxturn)
	    maxturn = msghistory[pos].turn;
    }
    maxturn_width = 0;
    while (maxturn) {
	maxturn_width++;
	maxturn /= 10;
    }
    if (maxturn_width < 1)
	maxturn_width = 1;

    /* Prevent duplicate turn stamps. */
    prevturn = 0;

    icount = 0;
    size = 10;
    items = malloc(size * sizeof(struct nh_menuitem));

    for (i = 0; i < histsize; i++) {
	int turn;
	const char *msg;

	pos = (histpos + i + 1) % histsize;

	if (!msghistory[pos].turn)
	    continue;

	turn = msghistory[pos].turn;
	msg = msghistory[pos].msg;

	if (strlen(msg) <= hist_msg_width - maxturn_width) {
	    if (turn != prevturn)
		snprintf(buf, MSGLEN+1, "T:%*d\t%s", maxturn_width, turn, msg);
	    else
		snprintf(buf, MSGLEN+1, "\t%s", msg);
	    add_menu_txt(items, size, icount, buf, MI_TEXT);
	} else {
	    int output_count, j;
	    char **output;

	    ui_wrap_text(hist_msg_width - maxturn_width, msg, &output_count, &output);

	    if (turn != prevturn)
		snprintf(buf, MSGLEN+1, "T:%*d\t%s", maxturn_width, turn, output[0]);
	    else
		snprintf(buf, MSGLEN+1, "\t%s", output[0]);
	    add_menu_txt(items, size, icount, buf, MI_TEXT);

	    for (j = 1; j < output_count; j++) {
		snprintf(buf, MSGLEN+1, "\t%s", output[j]);
		add_menu_txt(items, size, icount, buf, MI_TEXT);
	    }

	    ui_free_wrap(output);
	}

	prevturn = turn;
    }

    curses_display_menu_bottom(items, icount, "Message history:", PICK_NONE, NULL);
    free(items);
}